

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O2

QMainWindowLayoutState * __thiscall
QMainWindowLayoutState::operator=(QMainWindowLayoutState *this,QMainWindowLayoutState *param_1)

{
  Representation RVar1;
  Representation RVar2;
  Representation RVar3;
  
  this->mainWindow = param_1->mainWindow;
  RVar1.m_i = (param_1->rect).y1.m_i;
  RVar2.m_i = (param_1->rect).x2.m_i;
  RVar3.m_i = (param_1->rect).y2.m_i;
  (this->rect).x1 = (Representation)(param_1->rect).x1.m_i;
  (this->rect).y1 = (Representation)RVar1.m_i;
  (this->rect).x2 = (Representation)RVar2.m_i;
  (this->rect).y2 = (Representation)RVar3.m_i;
  QToolBarAreaLayout::operator=(&this->toolBarAreaLayout,&param_1->toolBarAreaLayout);
  QDockAreaLayout::operator=(&this->dockAreaLayout,&param_1->dockAreaLayout);
  return this;
}

Assistant:

class Q_AUTOTEST_EXPORT QMainWindowLayoutState
{
public:
    QRect rect;
    QMainWindow *mainWindow;

    QMainWindowLayoutState(QMainWindow *win);

#if QT_CONFIG(toolbar)
    QToolBarAreaLayout toolBarAreaLayout;
#endif

#if QT_CONFIG(dockwidget)
    QDockAreaLayout dockAreaLayout;
#else
    QLayoutItem *centralWidgetItem;
    QRect centralWidgetRect;
#endif

    void apply(bool animated);
    void deleteAllLayoutItems();
    void deleteCentralWidgetItem();

    QSize sizeHint() const;
    QSize minimumSize() const;
    bool fits() const;
    void fitLayout();

    QLayoutItem *itemAt(int index, int *x) const;
    QLayoutItem *takeAt(int index, int *x);
    QList<int> indexOf(QWidget *widget) const;
    QLayoutItem *item(const QList<int> &path);
    QRect itemRect(const QList<int> &path) const;
    QRect gapRect(const QList<int> &path) const; // ### get rid of this, use itemRect() instead

    bool contains(QWidget *widget) const;

    void setCentralWidget(QWidget *widget);
    QWidget *centralWidget() const;

    QList<int> gapIndex(QWidget *widget, const QPoint &pos) const;
    bool insertGap(const QList<int> &path, QLayoutItem *item);
    void remove(const QList<int> &path);
    void remove(QLayoutItem *item);
    void clear();
    bool isValid() const;

    QLayoutItem *plug(const QList<int> &path);
    QLayoutItem *unplug(const QList<int> &path, QMainWindowLayoutState *savedState = nullptr);

    void saveState(QDataStream &stream) const;
    bool checkFormat(QDataStream &stream);
    bool restoreState(QDataStream &stream, const QMainWindowLayoutState &oldState);
}